

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

Move __thiscall Board::checkMove(Board *this,size_t row,size_t col)

{
  reference pvVar1;
  ulong uVar2;
  Move MVar3;
  size_t sVar4;
  
  if (row != 0) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (&this->values,this->sizeInt * (row - 1) + col);
    if (*pvVar1 == this->nullValue) {
      makeMove(this,row,col,row - 1,col);
      return UP;
    }
  }
  sVar4 = this->sizeInt;
  uVar2 = sVar4 - 1;
  if (col < uVar2) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (&this->values,sVar4 * row + col + 1);
    if (*pvVar1 == this->nullValue) {
      makeMove(this,row,col,row,col + 1);
      return RIGHT;
    }
    sVar4 = this->sizeInt;
    uVar2 = sVar4 - 1;
  }
  if (row < uVar2) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (&this->values,sVar4 * (row + 1) + col);
    if (*pvVar1 == this->nullValue) {
      makeMove(this,row,col,row + 1,col);
      return DOWN;
    }
  }
  MVar3 = NOT_ALLOWED;
  if ((col != 0) &&
     (pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         (&this->values,(col + this->sizeInt * row) - 1), *pvVar1 == this->nullValue
     )) {
    makeMove(this,row,col,row,col - 1);
    MVar3 = LEFT;
  }
  return MVar3;
}

Assistant:

Move Board::checkMove( size_t row, size_t col )
{        
    if ( row > 0 && ( values.at(( row - 1 ) * sizeInt + col ) == nullValue ))
    {
        makeMove( row, col, row - 1, col );
        return Move::UP;
    }
    if ( col < ( sizeInt - 1 ) && ( values.at( row * sizeInt + col + 1 ) == nullValue ))
    {
        makeMove( row, col, row, col + 1 );
        return Move::RIGHT;
    }
    if ( row < ( sizeInt - 1 ) && ( values.at(( row + 1 ) * sizeInt + col )  == nullValue ))
    {
        makeMove( row, col, row + 1, col );
        return Move::DOWN;
    }
    if ( col > 0 && ( values.at( row * sizeInt + col - 1 ) == nullValue ))
    {
        makeMove( row, col, row, col -1 );
        return Move::LEFT;
    }

    return Move::NOT_ALLOWED;
}